

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_rkv.c
# Opt level: O0

MPP_RET hal_h265d_rkv_wait(void *hal,HalTaskInfo *task)

{
  RK_U32 RVar1;
  MppFrame local_50;
  MppFrame frame_out;
  MppFrame frame_ref;
  MppFrame mframe;
  long lStack_30;
  RK_S32 i;
  H265d_REGS_t *hw_regs;
  HalH265dCtx *reg_ctx;
  RK_S32 index;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  reg_ctx._4_4_ = MPP_OK;
  reg_ctx._0_4_ = (task->dec).reg_index;
  if (*(int *)((long)hal + 0x180) == 0) {
    lStack_30 = *(long *)((long)hal + 0x100);
  }
  else {
    lStack_30 = *(long *)((long)hal + (long)(int)reg_ctx * 0x28 + 0x128);
  }
  hw_regs = (H265d_REGS_t *)hal;
  _index = task;
  task_local = (HalTaskInfo *)hal;
  if ((((task->dec).flags.val >> 2 & 1) == 0) &&
     ((((task->dec).flags.val >> 3 & 1) == 0 || (*(int *)(*(long *)((long)hal + 0x18) + 0x30) != 0))
     )) {
    reg_ctx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0);
    if (reg_ctx._4_4_ != MPP_OK) {
      _mpp_log_l(2,"hal_h265d_rkv","poll cmd failed %d\n","hal_h265d_rkv_wait",
                 (ulong)(uint)reg_ctx._4_4_);
    }
  }
  else if ((hal_h265d_debug & 0x20) != 0) {
    _mpp_log_l(4,"hal_h265d_rkv","%s found task error\n",(char *)0x0,"hal_h265d_rkv_wait");
  }
  if ((((((_index->dec).flags.val >> 2 & 1) == 0) && (((_index->dec).flags.val >> 3 & 1) == 0)) &&
      ((*(uint *)(lStack_30 + 4) >> 0xe & 1) == 0)) &&
     (((*(uint *)(lStack_30 + 4) >> 0xf & 1) == 0 && ((*(uint *)(lStack_30 + 4) >> 0x10 & 1) == 0)))
     ) {
    if (((hw_regs->field_21).v345_reg_ends.reserve[0x1f] != 0) &&
       ((hw_regs->field_21).v345_reg_ends.reserve[0x23] != 0)) {
      for (mframe._4_4_ = 0; (int)mframe._4_4_ < 0x11; mframe._4_4_ = mframe._4_4_ + 1) {
        if (-1 < *(int *)((long)_index + (long)(int)mframe._4_4_ * 4 + 0x38)) {
          frame_out = (MppFrame)0x0;
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)&hw_regs->sw_y_virstride,
                     *(RK_S32 *)((long)_index + (long)(int)mframe._4_4_ * 4 + 0x38),SLOT_FRAME_PTR,
                     &frame_out);
          if ((hal_h265d_debug & 0x10) != 0) {
            _mpp_log_l(4,"hal_h265d_rkv","refer[%d] %d frame %p\n",(char *)0x0,(ulong)mframe._4_4_,
                       (ulong)*(uint *)((long)_index + (long)(int)mframe._4_4_ * 4 + 0x38),frame_out
                      );
          }
          if ((frame_out != (MppFrame)0x0) && (RVar1 = mpp_frame_get_errinfo(frame_out), RVar1 != 0)
             ) {
            local_50 = (MppFrame)0x0;
            mpp_buf_slot_get_prop
                      (*(MppBufSlots *)&hw_regs->sw_y_virstride,(_index->dec).output,SLOT_FRAME_PTR,
                       &local_50);
            mpp_frame_set_errinfo(local_50,1);
            break;
          }
        }
      }
    }
  }
  else if ((hw_regs->field_21).v345_reg_ends.reserve[0x1f] == 0) {
    if (*(long *)((long)&hw_regs->field_21 + 0x88) != 0) {
      mpp_callback_f("hal_h265d_rkv_wait",*(MppCbCtx **)((long)&hw_regs->field_21 + 0x88),_index);
    }
  }
  else {
    frame_ref = (MppFrame)0x0;
    mpp_buf_slot_get_prop
              (*(MppBufSlots *)&hw_regs->sw_y_virstride,(_index->dec).output,SLOT_FRAME_PTR,
               &frame_ref);
    if (frame_ref != (MppFrame)0x0) {
      (hw_regs->field_21).v345_reg_ends.reserve[0x23] = 1;
      mpp_frame_set_errinfo(frame_ref,1);
    }
  }
  if (((hal_h265d_debug & 8) != 0) && ((hal_h265d_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265d_rkv","RK_HEVC_DEC: regs[1]=0x%08X, regs[45]=0x%08x\n",(char *)0x0,
               (ulong)*(uint *)(lStack_30 + 4),(ulong)*(uint *)(lStack_30 + 0xb4));
  }
  if ((hw_regs->field_21).v345_reg_ends.reserve[0x1f] != 0) {
    hw_regs->reg_not_use0[(long)(int)reg_ctx * 10 + 0x12] = 0;
  }
  return reg_ctx._4_4_;
}

Assistant:

MPP_RET hal_h265d_rkv_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    RK_S32 index =  task->dec.reg_index;
    HalH265dCtx *reg_ctx = (HalH265dCtx *)hal;
    H265d_REGS_t *hw_regs = NULL;
    RK_S32 i;

    if (reg_ctx->fast_mode) {
        hw_regs = ( H265d_REGS_t *)reg_ctx->g_buf[index].hw_regs;
    } else {
        hw_regs = ( H265d_REGS_t *)reg_ctx->hw_regs;
    }

    if (task->dec.flags.parse_err ||
        (task->dec.flags.ref_err && !reg_ctx->cfg->base.disable_error)) {
        h265h_dbg(H265H_DBG_TASK_ERR, "%s found task error\n", __FUNCTION__);
        goto ERR_PROC;
    }

    ret = mpp_dev_ioctl(reg_ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

ERR_PROC:
    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err ||
        hw_regs->sw_interrupt.sw_dec_error_sta ||
        hw_regs->sw_interrupt.sw_dec_timeout_sta ||
        hw_regs->sw_interrupt.sw_dec_empty_sta) {
        if (!reg_ctx->fast_mode) {
            if (reg_ctx->dec_cb)
                mpp_callback(reg_ctx->dec_cb, &task->dec);
        } else {
            MppFrame mframe = NULL;
            mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.output,
                                  SLOT_FRAME_PTR, &mframe);
            if (mframe) {
                reg_ctx->fast_mode_err_found = 1;
                mpp_frame_set_errinfo(mframe, 1);
            }
        }
    } else {
        if (reg_ctx->fast_mode && reg_ctx->fast_mode_err_found) {
            for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(task->dec.refer); i++) {
                if (task->dec.refer[i] >= 0) {
                    MppFrame frame_ref = NULL;

                    mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.refer[i],
                                          SLOT_FRAME_PTR, &frame_ref);
                    h265h_dbg(H265H_DBG_FAST_ERR, "refer[%d] %d frame %p\n",
                              i, task->dec.refer[i], frame_ref);
                    if (frame_ref && mpp_frame_get_errinfo(frame_ref)) {
                        MppFrame frame_out = NULL;
                        mpp_buf_slot_get_prop(reg_ctx->slots, task->dec.output,
                                              SLOT_FRAME_PTR, &frame_out);
                        mpp_frame_set_errinfo(frame_out, 1);
                        break;
                    }
                }
            }
        }
    }

    if (hal_h265d_debug & H265H_DBG_REG) {
        h265h_dbg(H265H_DBG_REG, "RK_HEVC_DEC: regs[1]=0x%08X, regs[45]=0x%08x\n", ((RK_U32 *)hw_regs)[1], ((RK_U32 *)hw_regs)[45]);
    }

    if (reg_ctx->fast_mode) {
        reg_ctx->g_buf[index].use_flag = 0;
    }

    return ret;
}